

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::RegisterMulticastListener
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint8_t *aStatus,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aMulticastAddrList,uint32_t aTimeout)

{
  promise<ot::commissioner::Error> local_98;
  function<void_(const_unsigned_char_*,_ot::commissioner::Error)> local_78;
  undefined1 local_58 [8];
  anon_class_16_2_4e7d2e0f wait;
  promise<ot::commissioner::Error> pro;
  uint32_t aTimeout_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aMulticastAddrList_local;
  uint8_t *aStatus_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait.aStatus);
  local_58 = (undefined1  [8])&wait.aStatus;
  wait.pro = (promise<ot::commissioner::Error> *)aStatus;
  std::function<void(unsigned_char_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::RegisterMulticastListener(unsigned_char&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_int)::__0&,void>
            ((function<void(unsigned_char_const*,ot::commissioner::Error)> *)&local_78,
             (anon_class_16_2_4e7d2e0f *)local_58);
  (*(this->super_Commissioner)._vptr_Commissioner[0x31])
            (this,&local_78,aMulticastAddrList,(ulong)aTimeout);
  std::function<void_(const_unsigned_char_*,_ot::commissioner::Error)>::~function(&local_78);
  std::promise<ot::commissioner::Error>::get_future(&local_98);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_98);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_98);
  std::promise<ot::commissioner::Error>::~promise((promise<ot::commissioner::Error> *)&wait.aStatus)
  ;
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::RegisterMulticastListener(uint8_t                        &aStatus,
                                                  const std::vector<std::string> &aMulticastAddrList,
                                                  uint32_t                        aTimeout)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aStatus](const uint8_t *status, Error error) {
        if (status != nullptr)
        {
            aStatus = *status;
        }
        pro.set_value(error);
    };

    RegisterMulticastListener(wait, aMulticastAddrList, aTimeout);
    return pro.get_future().get();
}